

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_parse.c
# Opt level: O3

int mpt_color_parse(mpt_color *color,char *txt)

{
  char cVar1;
  char *__s;
  int iVar2;
  size_t sVar3;
  ushort **ppuVar4;
  long lVar5;
  int iVar6;
  
  if ((txt == (char *)0x0) || (*txt == '\0')) {
    iVar2 = 0;
    if (color != (mpt_color *)0x0) {
      mpt_color_set(color,0,0,0);
    }
  }
  else if (*txt == '#') {
    iVar2 = mpt_color_html(color,txt + 1);
    iVar2 = (uint)(0 < iVar2) + iVar2;
  }
  else {
    lVar5 = 0;
    do {
      __s = *(char **)((long)&mpt_color_parse::col[0].name + lVar5);
      sVar3 = strlen(__s);
      iVar6 = (int)sVar3;
      iVar2 = strncasecmp(__s,txt,(long)iVar6);
      if ((iVar2 == 0) &&
         ((cVar1 = txt[iVar6], (long)cVar1 == 0 ||
          (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0)
          ))) {
        if (color == (mpt_color *)0x0) {
          return iVar6;
        }
        *color = *(mpt_color *)(&mpt_color_parse::col[0].val.alpha + lVar5);
        return iVar6;
      }
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x80);
    iVar2 = -2;
  }
  return iVar2;
}

Assistant:

extern int mpt_color_parse(MPT_STRUCT(color) *color, const char *txt)
{
	static const struct {
		const char *name;
		MPT_STRUCT(color) val;
	} col[] = {
		{ "black",   { 0xff, 0, 0, 0 } },
		
		{ "red",     { 0xff, 0xff, 0, 0 } },
		{ "green",   { 0xff, 0, 0xff, 0 } },
		{ "blue",    { 0xff, 0, 0, 0xff } },
		
		{ "cyan",    { 0xff, 0, 0xff, 0xff } },
		{ "magenta", { 0xff, 0xff, 0, 0xff } },
		{ "yellow",  { 0xff, 0xff, 0xff, 0 } },
		
		{ "white",   { 0xff, 0xff, 0xff, 0xff } }
	};
	int len;
	
	if (!txt || !*txt) {
		if (color) mpt_color_set(color, 0, 0, 0);
		return 0;
	}
	if (!(*txt == '#')) {
		size_t i;
		
		for (i = 0; i < MPT_arrsize(col); i++) {
			len = strlen(col[i].name);
			if (!strncasecmp(col[i].name, txt, len) && (!txt[len] || isspace(txt[len]))) {
				if (color) *color = col[i].val;
				return len;
			}
		}
		return MPT_ERROR(BadValue);
	}
	len = mpt_color_html(color, txt+1);
	
	return len > 0 ? len+1 : len;
}